

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceVkImpl.cpp
# Opt level: O1

void __thiscall Diligent::FenceVkImpl::Reset(FenceVkImpl *this,Uint64 Value)

{
  atomic<unsigned_long> *Args_4;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  Uint64 UVar4;
  bool bVar5;
  char (*in_stack_ffffffffffffffb8) [2];
  Uint64 Value_local;
  string msg;
  
  Value_local = Value;
  if ((this->m_TimelineSemaphore).m_VkObject == (VkSemaphore_T *)0x0) {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_SyncPointsGuard);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    Args_4 = &(this->super_FenceBase<Diligent::EngineVkImplTraits>).m_LastCompletedFenceValue;
    if (Value_local <
        (this->super_FenceBase<Diligent::EngineVkImplTraits>).m_LastCompletedFenceValue.
        super___atomic_base<unsigned_long>._M_i) {
      FormatString<char[18],char_const*,char[17],unsigned_long,char[50],std::atomic<unsigned_long>,char[2]>
                (&msg,(Diligent *)"Resetting fence \'",
                 (char (*) [18])
                 &(this->super_FenceBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                  .m_Desc,(char **)"\' to the value (",(char (*) [17])&Value_local,
                 (unsigned_long *)") that is smaller than the last completed value (",
                 (char (*) [50])Args_4,(atomic<unsigned_long> *)0x752f31,in_stack_ffffffffffffffb8);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"Reset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
                 ,0xbc);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    uVar2 = (Args_4->super___atomic_base<unsigned_long>)._M_i;
    do {
      UVar4 = Value_local;
      if (Value_local < uVar2) {
        UVar4 = uVar2;
      }
      LOCK();
      uVar3 = (Args_4->super___atomic_base<unsigned_long>)._M_i;
      bVar5 = uVar2 == uVar3;
      if (bVar5) {
        (Args_4->super___atomic_base<unsigned_long>)._M_i = UVar4;
        uVar3 = uVar2;
      }
      UNLOCK();
      uVar2 = uVar3;
    } while (!bVar5);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_SyncPointsGuard);
  }
  else {
    FormatString<char[48]>(&msg,(char (*) [48])"Reset() is not supported for timeline semaphore");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Reset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
               ,0xb6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void FenceVkImpl::Reset(Uint64 Value)
{
    if (IsTimelineSemaphore())
    {
        DEV_ERROR("Reset() is not supported for timeline semaphore");
    }
    else
    {
        std::lock_guard<std::mutex> Lock{m_SyncPointsGuard};

        DEV_CHECK_ERR(Value >= m_LastCompletedFenceValue.load(), "Resetting fence '", m_Desc.Name, "' to the value (", Value, ") that is smaller than the last completed value (", m_LastCompletedFenceValue, ")");
        UpdateLastCompletedFenceValue(Value);
    }
}